

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O1

void duckdb::ColumnDataCopy<int>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ushort uVar1;
  ColumnDataCollectionSegment *this;
  ColumnDataAppendState *state;
  sel_t *psVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  byte bVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int *source_data_1;
  reference pvVar7;
  ulong uVar8;
  ColumnDataAllocator *this_01;
  data_ptr_t pdVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  VectorDataIndex prev_index;
  long lVar11;
  int *result_data;
  long lVar12;
  ulong uVar13;
  _Head_base<0UL,_unsigned_long_*,_false> local_88;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_80;
  unsigned_long local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  long local_50;
  ulong local_48;
  idx_t local_40;
  unsigned_long local_38;
  
  if (copy_count != 0) {
    this = meta_data->segment;
    state = meta_data->state;
    prev_index.index = (meta_data->vector_data_index).index;
    do {
      pvVar7 = vector<duckdb::VectorMetaData,_true>::operator[](&this->vector_data,prev_index.index)
      ;
      uVar13 = (ulong)(0x800 - pvVar7->count);
      uVar8 = copy_count;
      if (uVar13 < copy_count) {
        uVar8 = uVar13;
      }
      this_01 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
      pdVar9 = ColumnDataAllocator::GetDataPointer
                         (this_01,&state->current_chunk_state,pvVar7->block_id,pvVar7->offset);
      local_88._M_head_impl = (unsigned_long *)(pdVar9 + 0x2000);
      local_80.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_80.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_70 = 0x800;
      if (pvVar7->count == 0) {
        switchD_005700f1::default(local_88._M_head_impl,0xff,0x100);
      }
      local_48 = copy_count;
      if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (uVar13 != 0) {
          pdVar4 = source_data->data;
          psVar2 = source_data->sel->sel_vector;
          uVar1 = pvVar7->count;
          lVar11 = 0;
          do {
            if (psVar2 == (sel_t *)0x0) {
              uVar13 = offset + lVar11;
            }
            else {
              uVar13 = (ulong)psVar2[offset + lVar11];
            }
            *(undefined4 *)(pdVar9 + lVar11 * 4 + (ulong)uVar1 * 4) =
                 *(undefined4 *)(pdVar4 + uVar13 * 4);
            lVar11 = lVar11 + 1;
          } while (uVar8 + (uVar8 == 0) != lVar11);
        }
      }
      else if (uVar13 != 0) {
        lVar11 = offset * 4;
        lVar12 = 0;
        local_50 = lVar11;
        local_40 = offset;
        do {
          psVar2 = source_data->sel->sel_vector;
          if (psVar2 == (sel_t *)0x0) {
            uVar13 = offset + lVar12;
          }
          else {
            uVar13 = (ulong)*(uint *)((long)psVar2 + lVar12 * 4 + lVar11);
          }
          puVar3 = (source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 == (unsigned_long *)0x0) ||
             ((puVar3[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)) {
            *(undefined4 *)(pdVar9 + lVar12 * 4 + (ulong)pvVar7->count * 4) =
                 *(undefined4 *)(source_data->data + uVar13 * 4);
          }
          else {
            uVar1 = pvVar7->count;
            if (local_88._M_head_impl == (unsigned_long *)0x0) {
              local_38 = local_70;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_68,&local_38);
              p_Var6 = p_Stack_60;
              local_80.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = local_68;
              this_00._M_pi =
                   local_80.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
              local_68 = (element_type *)0x0;
              p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_80.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var6;
              if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
              }
              if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
              }
              pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&local_80);
              local_88._M_head_impl =
                   (pTVar10->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              lVar11 = local_50;
            }
            uVar13 = (ulong)uVar1 + lVar12;
            bVar5 = (byte)uVar13 & 0x3f;
            local_88._M_head_impl[uVar13 >> 6] =
                 local_88._M_head_impl[uVar13 >> 6] &
                 (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            offset = local_40;
          }
          lVar12 = lVar12 + 1;
        } while (uVar8 + (uVar8 == 0) != lVar12);
      }
      pvVar7->count = pvVar7->count + (short)uVar8;
      copy_count = local_48 - uVar8;
      if (copy_count != 0) {
        if ((pvVar7->next_data).index == 0xffffffffffffffff) {
          ColumnDataCollectionSegment::AllocateVector
                    (this,&source->type,meta_data->chunk_data,&state->current_chunk_state,prev_index
                    );
        }
        pvVar7 = vector<duckdb::VectorMetaData,_true>::operator[]
                           (&this->vector_data,prev_index.index);
        prev_index.index = (pvVar7->next_data).index;
      }
      if (local_80.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      offset = offset + uVar8;
    } while (copy_count != 0);
  }
  return;
}

Assistant:

static void ColumnDataCopy(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                           idx_t offset, idx_t copy_count) {
	TemplatedColumnDataCopy<StandardValueCopy<T>>(meta_data, source_data, source, offset, copy_count);
}